

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::Header6::operator==(Header6 *this,Header6 *Value)

{
  KBOOL KVar1;
  
  if (this->m_ui8ProtocolVersion != Value->m_ui8ProtocolVersion) {
    return false;
  }
  if ((((this->m_ui8ExerciseID == Value->m_ui8ExerciseID) &&
       (this->m_ui8PDUType == Value->m_ui8PDUType)) &&
      (this->m_ui8ProtocolFamily == Value->m_ui8ProtocolFamily)) &&
     (KVar1 = DATA_TYPE::TimeStamp::operator!=(&this->m_TimeStamp,&Value->m_TimeStamp), !KVar1)) {
    return this->m_ui16PDULength == Value->m_ui16PDULength;
  }
  return false;
}

Assistant:

KBOOL Header6::operator == ( const Header6 & Value ) const
{
    if( m_ui8ProtocolVersion != Value.m_ui8ProtocolVersion ) return false;
    if( m_ui8ExerciseID      != Value.m_ui8ExerciseID )      return false;
    if( m_ui8PDUType         != Value.m_ui8PDUType )         return false;
    if( m_ui8ProtocolFamily  != Value.m_ui8ProtocolFamily )  return false;
    if( m_TimeStamp          != Value.m_TimeStamp )          return false;
    if( m_ui16PDULength      != Value.m_ui16PDULength )      return false;
    return true;
}